

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtractFunction.cpp
# Opt level: O2

void __thiscall wasm::ExtractFunctionIndex::run(ExtractFunctionIndex *this,Module *module)

{
  ostream *poVar1;
  char *pcVar2;
  pointer puVar3;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> _Var4;
  uint uVar5;
  pointer pcVar6;
  char *in_R8;
  Name name;
  undefined1 local_1f0 [392];
  string local_68;
  undefined1 local_48 [8];
  string index;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1f0,"extract-function-index",
             (allocator<char> *)(index.field_2._M_local_buf + 0xe));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "ExtractFunctionIndex usage: wasm-opt --extract-function-index=FUNCTION_INDEX",
             (allocator<char> *)(index.field_2._M_local_buf + 0xf));
  Pass::getArgument((string *)local_48,&this->super_Pass,(string *)local_1f0,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)local_1f0);
  pcVar6 = (pointer)0x0;
  do {
    if (index._M_dataplus._M_p == pcVar6) {
      uVar5 = std::__cxx11::stoi((string *)local_48,(size_t *)0x0,10);
      puVar3 = (module->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)uVar5 <
          (ulong)((long)(module->functions).
                        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3)) {
        _Var4._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
             puVar3[uVar5]._M_t.
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t;
        name.super_IString.str._M_str = in_R8;
        name.super_IString.str._M_len =
             *(size_t *)
              ((long)_Var4._M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8);
        wasm::extract((wasm *)(this->super_Pass).runner,(PassRunner *)module,
                      *(Module **)
                       _Var4._M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,name);
        std::__cxx11::string::~string((string *)local_48);
        return;
      }
      Fatal::Fatal((Fatal *)local_1f0);
      poVar1 = (ostream *)(local_1f0 + 0x10);
      std::operator<<(poVar1,"Out of bounds function index ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1,"! (module has only ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      Fatal::operator<<((Fatal *)local_1f0,(char (*) [12])" functions)");
      goto LAB_009e4b6e;
    }
    pcVar2 = (char *)((long)local_48 + (long)pcVar6);
    pcVar6 = pcVar6 + 1;
  } while ((int)*pcVar2 - 0x30U < 10);
  Fatal::Fatal((Fatal *)local_1f0);
  Fatal::operator<<((Fatal *)local_1f0,(char (*) [32])"Expected numeric function index");
LAB_009e4b6e:
  Fatal::~Fatal((Fatal *)local_1f0);
}

Assistant:

void run(Module* module) override {
    std::string index = getArgument("extract-function-index",
                                    "ExtractFunctionIndex usage: wasm-opt "
                                    "--extract-function-index=FUNCTION_INDEX");
    for (char c : index) {
      if (!std::isdigit(c)) {
        Fatal() << "Expected numeric function index";
      }
    }
    Index i = std::stoi(index);
    if (i >= module->functions.size()) {
      Fatal() << "Out of bounds function index " << i << "! (module has only "
              << module->functions.size() << " functions)";
    }
    // Assumes imports are at the beginning
    Name name = module->functions[i]->name;
    extract(getPassRunner(), module, name);
  }